

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checks.h
# Opt level: O0

string * rtc::MakeCheckOpString<webrtc::WavFormat,webrtc::WavFormat>
                   (WavFormat *v1,WavFormat *v2,char *names)

{
  ostream *poVar1;
  string *psVar2;
  string *msg;
  ostringstream local_198 [8];
  ostringstream ss;
  char *names_local;
  WavFormat *v2_local;
  WavFormat *v1_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,names);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*v1);
  poVar1 = std::operator<<(poVar1," vs. ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*v2);
  std::operator<<(poVar1,")");
  psVar2 = (string *)operator_new(0x20);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return psVar2;
}

Assistant:

std::string* MakeCheckOpString(const t1& v1, const t2& v2, const char* names) {
  std::ostringstream ss;
  ss << names << " (" << v1 << " vs. " << v2 << ")";
  std::string* msg = new std::string(ss.str());
  return msg;
}